

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_huffman_encode_char(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  byte bVar1;
  cram_codec *pcVar2;
  uint uVar3;
  cram_encoding *pcVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = 0;
  do {
    bVar1 = *in;
    if ((char)bVar1 < '\0') {
      uVar3 = (c->field_6).e_huffman.nvals;
      uVar6 = 0;
      if (0 < (int)uVar3) {
        uVar6 = (ulong)uVar3;
      }
      lVar5 = 0;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        if (*(cram_encoding *)((long)&((c->field_6).byte_array_len.len_codec)->codec + lVar5) ==
            (uint)bVar1) {
          uVar6 = uVar8 & 0xffffffff;
          break;
        }
        lVar5 = lVar5 + 0x10;
      }
      if ((uint)uVar6 == uVar3) {
        return -1;
      }
      pcVar4 = &((c->field_6).byte_array_len.len_codec)->codec + uVar6 * 4;
    }
    else {
      lVar5 = (long)*(int *)((long)&c->field_6 + (ulong)bVar1 * 4 + 0x10);
      pcVar2 = (c->field_6).byte_array_len.len_codec;
      if ((&pcVar2->codec)[lVar5 * 4] != (uint)bVar1) {
        __assert_fail("c->e_huffman.codes[i].symbol == sym",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                      ,0x437,"int cram_huffman_encode_char(cram_slice *, cram_codec *, char *, int)"
                     );
      }
      pcVar4 = &pcVar2->codec + lVar5 * 4;
    }
    in = (char *)((byte *)in + 1);
    uVar3 = store_bits_MSB(c->out,pcVar4[2],pcVar4[3]);
    uVar7 = uVar7 | uVar3;
    in_size = in_size + -1;
    if (in_size == 0) {
      return uVar7;
    }
  } while( true );
}

Assistant:

int cram_huffman_encode_char(cram_slice *slice, cram_codec *c,
			     char *in, int in_size) {
    int i, code, len, r = 0;
    unsigned char *syms = (unsigned char *)in;

    do {
	int sym = *syms++;
	if (sym >= -1 && sym < MAX_HUFF) {
	    i = c->e_huffman.val2code[sym+1];
	    assert(c->e_huffman.codes[i].symbol == sym);
	    code = c->e_huffman.codes[i].code;
	    len  = c->e_huffman.codes[i].len;
	} else {
	    /* Slow - use a lookup table for when sym < MAX_HUFF? */
	    for (i = 0; i < c->e_huffman.nvals; i++) {
		if (c->e_huffman.codes[i].symbol == sym)
		    break;
	    }
	    if (i == c->e_huffman.nvals)
		return -1;
    
	    code = c->e_huffman.codes[i].code;
	    len  = c->e_huffman.codes[i].len;
	}

	r |= store_bits_MSB(c->out, code, len);
    } while (--in_size);

    return r;
}